

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O1

void __thiscall
diy::Master::Master(Master *this,communicator *comm,int threads__,int limit__,CreateBlock *create_,
                   DestroyBlock *destroy_,ExternalStorage *storage,SaveBlock *save,LoadBlock *load_,
                   QueuePolicy *q_policy)

{
  Collection *this_00;
  _Rb_tree_header *p_Var1;
  int *piVar2;
  communicator *pcVar3;
  _List_node_base *p_Var4;
  InFlightRecvsMap *pIVar5;
  CollectivesMap *pCVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long lVar8;
  MPI_Comm poVar9;
  _Base_ptr p_Var10;
  pointer ppLVar11;
  random_device rd;
  mt19937 gen;
  int local_27dc;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  *local_27d8;
  Profiler *local_27d0;
  Collection *local_27c8;
  _Any_data local_27c0;
  code *local_27b0;
  _Any_data local_27a0;
  code *local_2790;
  _Any_data local_2780;
  code *local_2770;
  _Any_data local_2760;
  code *local_2750;
  undefined1 local_2740 [5000];
  MPI_Comm local_13b8;
  ulong local_13b0 [623];
  undefined8 local_38;
  
  (this->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::function<void_*()>::function((function<void_*()> *)&local_2760,create_);
  std::function<void_(void_*)>::function((function<void_(void_*)> *)&local_2780,destroy_);
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)&local_27a0,save);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
            ((function<void_(void_*,_diy::BinaryBuffer_&)> *)&local_27c0,load_);
  this_00 = &this->blocks_;
  Collection::Collection
            (this_00,(Create *)&local_2760,(Destroy *)&local_2780,storage,(Save *)&local_27a0,
             (Load *)&local_27c0);
  if (local_27b0 != (code *)0x0) {
    (*local_27b0)(&local_27c0,&local_27c0,__destroy_functor);
  }
  if (local_2790 != (code *)0x0) {
    (*local_2790)(&local_27a0,&local_27a0,__destroy_functor);
  }
  if (local_2770 != (code *)0x0) {
    (*local_2770)(&local_2780,&local_2780,__destroy_functor);
  }
  if (local_2750 != (code *)0x0) {
    (*local_2750)(&local_2760,&local_2760,__destroy_functor);
  }
  (this->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->lids_)._M_t._M_impl.super__Rb_tree_header;
  (this->lids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lids_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->queue_policy_ = q_policy;
  this->limit_ = limit__;
  local_27c8 = this_00;
  if (threads__ == -1) {
    threads__ = std::thread::hardware_concurrency();
  }
  this->threads_ = threads__;
  this->storage_ = storage;
  (this->comm_).comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  piVar2 = &(this->comm_).rank_;
  (this->comm_).rank_ = 0;
  (this->comm_).size_ = 1;
  (this->comm_).owner_ = false;
  MPI_Comm_rank(&ompi_mpi_comm_world,piVar2);
  pcVar3 = &this->comm_;
  MPI_Comm_size((pcVar3->comm_).data,&(this->comm_).size_);
  p_Var1 = &(this->incoming_)._M_t._M_impl.super__Rb_tree_header;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->outgoing_)._M_t._M_impl.super__Rb_tree_header;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = (_List_node_base *)operator_new(0x18);
  *(_List_node_base **)
   &((list<diy::Master::InFlightSend,_std::allocator<diy::Master::InFlightSend>_> *)&p_Var4->_M_prev
    )->super__List_base<diy::Master::InFlightSend,_std::allocator<diy::Master::InFlightSend>_> =
       p_Var4;
  p_Var4->_M_next = p_Var4;
  p_Var4[1]._M_next = 0;
  (this->inflight_sends_)._M_t.
  super___uniq_ptr_impl<diy::Master::InFlightSendsList,_std::default_delete<diy::Master::InFlightSendsList>_>
  ._M_t.
  super__Tuple_impl<0UL,_diy::Master::InFlightSendsList_*,_std::default_delete<diy::Master::InFlightSendsList>_>
  .super__Head_base<0UL,_diy::Master::InFlightSendsList_*,_false>._M_head_impl =
       (InFlightSendsList *)p_Var4;
  pIVar5 = (InFlightRecvsMap *)operator_new(0x30);
  p_Var10 = (_Base_ptr)
            ((long)&(pIVar5->
                    super_map<int,_diy::Master::InFlightRecv,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::InFlightRecv>_>_>
                    )._M_t + 8);
  (((_Rb_tree_header *)
   ((long)&(pIVar5->
           super_map<int,_diy::Master::InFlightRecv,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::InFlightRecv>_>_>
           )._M_t + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(pIVar5->
           super_map<int,_diy::Master::InFlightRecv,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::InFlightRecv>_>_>
           )._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(pIVar5->
           super_map<int,_diy::Master::InFlightRecv,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::InFlightRecv>_>_>
           )._M_t + 0x18) = p_Var10;
  *(_Base_ptr *)
   ((long)&(pIVar5->
           super_map<int,_diy::Master::InFlightRecv,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::InFlightRecv>_>_>
           )._M_t + 0x20) = p_Var10;
  *(size_t *)
   ((long)&(pIVar5->
           super_map<int,_diy::Master::InFlightRecv,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::InFlightRecv>_>_>
           )._M_t + 0x28) = 0;
  (this->inflight_recvs_)._M_t.
  super___uniq_ptr_impl<diy::Master::InFlightRecvsMap,_std::default_delete<diy::Master::InFlightRecvsMap>_>
  ._M_t.
  super__Tuple_impl<0UL,_diy::Master::InFlightRecvsMap_*,_std::default_delete<diy::Master::InFlightRecvsMap>_>
  .super__Head_base<0UL,_diy::Master::InFlightRecvsMap_*,_false>._M_head_impl = pIVar5;
  pCVar6 = (CollectivesMap *)operator_new(0x30);
  p_Var10 = (_Base_ptr)
            ((long)&(pCVar6->
                    super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
                    )._M_t + 8);
  (((_Rb_tree_header *)
   ((long)&(pCVar6->
           super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
           )._M_t + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(pCVar6->
           super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
           )._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(pCVar6->
           super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
           )._M_t + 0x18) = p_Var10;
  *(_Base_ptr *)
   ((long)&(pCVar6->
           super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
           )._M_t + 0x20) = p_Var10;
  *(size_t *)
   ((long)&(pCVar6->
           super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
           )._M_t + 0x28) = 0;
  (this->collectives_)._M_t.
  super___uniq_ptr_impl<diy::Master::CollectivesMap,_std::default_delete<diy::Master::CollectivesMap>_>
  ._M_t.
  super__Tuple_impl<0UL,_diy::Master::CollectivesMap_*,_std::default_delete<diy::Master::CollectivesMap>_>
  .super__Head_base<0UL,_diy::Master::CollectivesMap_*,_false>._M_head_impl = pCVar6;
  this->expected_ = 0;
  this->exchange_round_ = -1;
  this->immediate_ = true;
  (this->log).super___shared_ptr<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->commands_).
  super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->commands_).
  super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->commands_).
           super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->commands_).
           super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014f090;
  (this->log).super___shared_ptr<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var7;
  (this->log).super___shared_ptr<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var7 + 1);
  local_27d0 = &this->prof;
  (this->prof).total.last._M_h._M_buckets = &(this->prof).total.last._M_h._M_single_bucket;
  (this->prof).total.last._M_h._M_bucket_count = 1;
  (this->prof).total.last._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->prof).total.last._M_h._M_element_count = 0;
  (this->prof).total.last._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->prof).total.last._M_h._M_rehash_policy._M_next_resize = 0;
  (this->prof).total.last._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_27d8 = &(this->prof).total.duration;
  (this->prof).total.duration._M_h._M_buckets = &(this->prof).total.duration._M_h._M_single_bucket;
  (this->prof).total.duration._M_h._M_bucket_count = 1;
  (this->prof).total.duration._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->prof).total.duration._M_h._M_element_count = 0;
  (this->prof).total.duration._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->prof).total.duration._M_h._M_rehash_policy._M_next_resize = 0;
  (this->prof).total.duration._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mt_gen)._M_x[0] = 0x1571;
  ppLVar11 = (pointer)0x1571;
  lVar8 = 0x56;
  do {
    ppLVar11 = (pointer)(ulong)((((uint)((ulong)ppLVar11 >> 0x1e) ^ (uint)ppLVar11) * 0x6c078965 +
                                (int)lVar8) - 0x55);
    (&(this->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start)[lVar8] = ppLVar11;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x2c5);
  (this->mt_gen)._M_p = 0x270;
  MPI_Comm_dup((comm->comm_).data,&local_13b8);
  local_2740._0_8_ = local_13b8;
  local_2740._8_8_ = 0x100000000;
  local_2740[0x10] = 1;
  if (local_13b8 != (MPI_Comm)&ompi_mpi_comm_null) {
    MPI_Comm_rank(local_13b8,
                  &(((anon_union_5000_2_650ea050_for_random_device_0 *)local_2740)->field_0)._M_func
                 );
    MPI_Comm_size(local_2740._0_8_);
  }
  if ((this->comm_).owner_ == true) {
    MPI_Comm_free(pcVar3);
  }
  (this->comm_).comm_.data = (MPI_Comm)local_2740._0_8_;
  (this->comm_).rank_ = local_2740._8_4_;
  (this->comm_).size_ = local_2740._12_4_;
  (this->comm_).owner_ = (bool)local_2740[0x10];
  local_2740[0x10] = 0;
  mpi::communicator::~communicator
            ((communicator *)
             &((anon_union_5000_2_650ea050_for_random_device_0 *)local_2740)->field_0);
  std::random_device::random_device
            ((random_device *)
             &((anon_union_5000_2_650ea050_for_random_device_0 *)local_2740)->field_0);
  local_27dc = std::random_device::_M_getval();
  MPI_Bcast(&local_27dc,1,&ompi_mpi_unsigned,0,(pcVar3->comm_).data);
  local_13b8 = (MPI_Comm)(ulong)(uint)(*piVar2 + local_27dc);
  lVar8 = 1;
  poVar9 = local_13b8;
  do {
    poVar9 = (MPI_Comm)
             (ulong)(((uint)((ulong)poVar9 >> 0x1e) ^ (uint)poVar9) * 0x6c078965 + (int)lVar8);
    local_13b0[lVar8 + -1] = (ulong)poVar9;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_38 = 0x270;
  memcpy(&this->mt_gen,&local_13b8,5000);
  std::random_device::_M_fini();
  return;
}

Assistant:

diy::Master::
Master(mpi::communicator    comm,
       int                  threads__,
       int                  limit__,
       CreateBlock          create_,
       DestroyBlock         destroy_,
       ExternalStorage*     storage,
       SaveBlock            save,
       LoadBlock            load_,
       QueuePolicy*         q_policy):
  blocks_(create_, destroy_, storage, save, load_),
  queue_policy_(q_policy),
  limit_(limit__),
#if !defined(DIY_NO_THREADS)
  threads_(threads__ == -1 ? static_cast<int>(thread::hardware_concurrency()) : threads__),
#else
  threads_(1),
#endif
  storage_(storage),
  // Communicator functionality
  inflight_sends_(new InFlightSendsList),
  inflight_recvs_(new InFlightRecvsMap),
  collectives_(new CollectivesMap)
{
#ifdef DIY_NO_THREADS
  (void) threads__;
#endif
    comm_.duplicate(comm);

    // seed random number generator, broadcast seed, offset by rank
    std::random_device rd;                      // seed source for the random number engine
    unsigned int s = rd();
    diy::mpi::broadcast(communicator(), s, 0);
    std::mt19937 gen(s + communicator().rank());          // mersenne_twister random number generator
    mt_gen = gen;
}